

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t match_list_unmatched_inclusions_next
                  (archive_match *a,match_list *list,wchar_t mbs,void **vp)

{
  match **ppmVar1;
  wchar_t wVar2;
  int *piVar3;
  wchar_t *pwVar4;
  match *pmVar5;
  wchar_t *local_30;
  
  *vp = (void *)0x0;
  if (list->unmatched_eof != L'\0') {
    list->unmatched_eof = L'\0';
    return L'\x01';
  }
  if (list->unmatched_next == (match *)0x0) {
    if (list->unmatched_count == L'\0') {
      return L'\x01';
    }
    list->unmatched_next = list->first;
  }
  ppmVar1 = &list->unmatched_next;
  pmVar5 = (match *)ppmVar1;
  do {
    pmVar5 = pmVar5->next;
    if (pmVar5 == (match *)0x0) {
      *ppmVar1 = (match *)0x0;
      return L'\x01';
    }
  } while (pmVar5->matches != 0);
  if (mbs == L'\0') {
    wVar2 = archive_mstring_get_wcs(&a->archive,&pmVar5->pattern,&local_30);
    if ((wVar2 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) goto LAB_004315fe;
    pwVar4 = anon_var_dwarf_16f8c0a + 6;
  }
  else {
    wVar2 = archive_mstring_get_mbs(&a->archive,&pmVar5->pattern,(char **)&local_30);
    if ((wVar2 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
LAB_004315fe:
      archive_set_error(&a->archive,0xc,"No memory");
      (a->archive).state = 0x8000;
      return L'\xffffffe2';
    }
    pwVar4 = L"";
  }
  if (local_30 != (wchar_t *)0x0) {
    pwVar4 = local_30;
  }
  *vp = pwVar4;
  pmVar5 = pmVar5->next;
  *ppmVar1 = pmVar5;
  if (pmVar5 == (match *)0x0) {
    list->unmatched_eof = L'\x01';
  }
  return L'\0';
}

Assistant:

static int
match_list_unmatched_inclusions_next(struct archive_match *a,
    struct match_list *list, int mbs, const void **vp)
{
	struct match *m;

	*vp = NULL;
	if (list->unmatched_eof) {
		list->unmatched_eof = 0;
		return (ARCHIVE_EOF);
	}
	if (list->unmatched_next == NULL) {
		if (list->unmatched_count == 0)
			return (ARCHIVE_EOF);
		list->unmatched_next = list->first;
	}

	for (m = list->unmatched_next; m != NULL; m = m->next) {
		int r;

		if (m->matches)
			continue;
		if (mbs) {
			const char *p;
			r = archive_mstring_get_mbs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = "";
			*vp = p;
		} else {
			const wchar_t *p;
			r = archive_mstring_get_wcs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = L"";
			*vp = p;
		}
		list->unmatched_next = m->next;
		if (list->unmatched_next == NULL)
			/* To return EOF next time. */
			list->unmatched_eof = 1;
		return (ARCHIVE_OK);
	}
	list->unmatched_next = NULL;
	return (ARCHIVE_EOF);
}